

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IsLocaleValue(Fts5Config *pConfig,sqlite3_value *pVal)

{
  uint uVar1;
  Fts5Global *pFVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  
  uVar1._0_2_ = pVal->flags;
  uVar1._2_1_ = pVal->enc;
  uVar1._3_1_ = pVal->eSubtype;
  uVar5 = 0;
  if ((0x1000000010001U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
    pcVar4 = (char *)sqlite3_value_blob(pVal);
    iVar3 = sqlite3_value_bytes(pVal);
    if (0x10 < iVar3) {
      pFVar2 = pConfig->pGlobal;
      auVar6[0] = -((char)pFVar2->aLocaleHdr[0] == *pcVar4);
      auVar6[1] = -(*(char *)((long)pFVar2->aLocaleHdr + 1) == pcVar4[1]);
      auVar6[2] = -(*(char *)((long)pFVar2->aLocaleHdr + 2) == pcVar4[2]);
      auVar6[3] = -(*(char *)((long)pFVar2->aLocaleHdr + 3) == pcVar4[3]);
      auVar6[4] = -((char)pFVar2->aLocaleHdr[1] == pcVar4[4]);
      auVar6[5] = -(*(char *)((long)pFVar2->aLocaleHdr + 5) == pcVar4[5]);
      auVar6[6] = -(*(char *)((long)pFVar2->aLocaleHdr + 6) == pcVar4[6]);
      auVar6[7] = -(*(char *)((long)pFVar2->aLocaleHdr + 7) == pcVar4[7]);
      auVar6[8] = -((char)pFVar2->aLocaleHdr[2] == pcVar4[8]);
      auVar6[9] = -(*(char *)((long)pFVar2->aLocaleHdr + 9) == pcVar4[9]);
      auVar6[10] = -(*(char *)((long)pFVar2->aLocaleHdr + 10) == pcVar4[10]);
      auVar6[0xb] = -(*(char *)((long)pFVar2->aLocaleHdr + 0xb) == pcVar4[0xb]);
      auVar6[0xc] = -((char)pFVar2->aLocaleHdr[3] == pcVar4[0xc]);
      auVar6[0xd] = -(*(char *)((long)pFVar2->aLocaleHdr + 0xd) == pcVar4[0xd]);
      auVar6[0xe] = -(*(char *)((long)pFVar2->aLocaleHdr + 0xe) == pcVar4[0xe]);
      auVar6[0xf] = -(*(char *)((long)pFVar2->aLocaleHdr + 0xf) == pcVar4[0xf]);
      uVar5 = (uint)((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                             (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff);
    }
  }
  return uVar5;
}

Assistant:

static int sqlite3Fts5IsLocaleValue(Fts5Config *pConfig, sqlite3_value *pVal){
  int ret = 0;
  if( sqlite3_value_type(pVal)==SQLITE_BLOB ){
    /* Call sqlite3_value_bytes() after sqlite3_value_blob() in this case.
    ** If the blob was created using zeroblob(), then sqlite3_value_blob()
    ** may call malloc(). If this malloc() fails, then the values returned
    ** by both value_blob() and value_bytes() will be 0. If value_bytes() were
    ** called first, then the NULL pointer returned by value_blob() might
    ** be dereferenced.  */
    const u8 *pBlob = sqlite3_value_blob(pVal);
    int nBlob = sqlite3_value_bytes(pVal);
    if( nBlob>FTS5_LOCALE_HDR_SIZE
     && 0==memcmp(pBlob, FTS5_LOCALE_HDR(pConfig), FTS5_LOCALE_HDR_SIZE)
    ){
      ret = 1;
    }
  }
  return ret;
}